

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

bool parsePara(int argc,char **argv)

{
  byte bVar1;
  char *pcVar2;
  Strategy SVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  string branch;
  allocator local_51;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  bVar6 = argc < 2;
  if (1 < argc) {
    iVar5 = 1;
    do {
      pcVar2 = argv[iVar5];
      if (*pcVar2 == '-') {
        bVar1 = pcVar2[1];
        pcVar2 = elf_file_name;
        if (bVar1 < 0x73) {
          if (bVar1 == 0x62) {
            iVar5 = iVar5 + 1;
            if (argc <= iVar5) break;
            std::__cxx11::string::string((string *)local_50,argv[iVar5],&local_51);
            iVar4 = std::__cxx11::string::compare((char *)local_50);
            if (iVar4 == 0) {
              SVar3 = AT;
            }
            else {
              iVar4 = std::__cxx11::string::compare((char *)local_50);
              if (iVar4 == 0) {
                SVar3 = NT;
              }
              else {
                iVar4 = std::__cxx11::string::compare((char *)local_50);
                if (iVar4 == 0) {
                  SVar3 = BTFNT;
                }
                else {
                  iVar4 = std::__cxx11::string::compare((char *)local_50);
                  SVar3 = BPB;
                  if (iVar4 != 0) {
                    if (local_50[0] != local_40) {
                      operator_delete(local_50[0]);
                    }
                    break;
                  }
                }
              }
            }
            strategy = SVar3;
            pcVar2 = elf_file_name;
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
              pcVar2 = elf_file_name;
            }
          }
          else {
            if (bVar1 != 100) break;
            dump_history = true;
          }
        }
        else if (bVar1 == 0x73) {
          single_step = true;
        }
        else {
          if (bVar1 != 0x76) break;
          verbose = true;
        }
      }
      elf_file_name = pcVar2;
      iVar5 = iVar5 + 1;
      bVar6 = argc <= iVar5;
    } while (iVar5 < argc);
  }
  return (bool)(elf_file_name != (char *)0x0 & bVar6);
}

Assistant:

bool parsePara(int argc, char **argv) {
    for (int i = 1; i < argc; i++) {
        if (argv[i][0] == '-') {
            switch (argv[i][1]) {
                case 'v':
                    verbose = true;
                    break;
                case 's':
                    single_step = true;
                    break;
                case 'd':
                    dump_history = true;
                    break;
                case 'b':
                    if (i + 1 < argc) {
                        string branch = argv[++i];
                        if (branch == "AT") {
                            strategy = BranchPredictor::Strategy::AT;
                        } else if (branch == "NT") {
                            strategy = BranchPredictor::Strategy::NT;
                        } else if (branch == "BTFNT") {
                            strategy = BranchPredictor::Strategy::BTFNT;
                        } else if (branch == "BPB") {
                            strategy = BranchPredictor::Strategy::BPB;
                        } else {
                            return false;
                        }
                    } else {
                        return false;
                    }
                    break;
                default:
                    return false;
            }
        } else {
            elf_file_name = argv[i];
        }
    }

    return elf_file_name != nullptr;
}